

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int base64_encode_block(char *in_bin,int in_len,char *out_base64,int out_len,
                       base64_encodestate *state)

{
  byte bVar1;
  base64_encodestep bVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  byte local_59;
  char fragment;
  char result;
  char *out_end;
  char *out_pos;
  char *in_pos;
  char *in_end;
  base64_encodestate *state_local;
  int out_len_local;
  char *out_base64_local;
  int in_len_local;
  char *in_bin_local;
  
  pcVar6 = in_bin + in_len;
  pcVar7 = out_base64 + out_len;
  local_59 = state->result;
  bVar2 = state->step;
  iVar3 = (int)out_base64;
  pcVar9 = out_base64;
  out_pos = in_bin;
  if (bVar2 == step_A) goto LAB_0011a312;
  out_end = out_base64;
  out_pos = in_bin;
  if (bVar2 == step_B) goto LAB_0011a399;
  out_end = out_base64;
  out_pos = in_bin;
  if (bVar2 == step_C) {
    while ((out_pos != pcVar6 && (out_end + 2 < pcVar7))) {
      pcVar8 = out_pos + 1;
      bVar1 = *out_pos;
      cVar4 = base64_encode_value(local_59 | (byte)((int)((int)(char)bVar1 & 0xc0U) >> 6));
      *out_end = cVar4;
      local_59 = bVar1 & 0x3f;
      cVar4 = base64_encode_value(local_59);
      pcVar9 = out_end + 2;
      out_end[1] = cVar4;
      uVar5 = state->stepcount + 1;
      state->stepcount = uVar5;
      out_pos = pcVar8;
      if ((uVar5 & 0x3fffffff) == 0x12) {
        if (pcVar7 <= pcVar9) {
          return (int)pcVar9 - iVar3;
        }
        *pcVar9 = '\n';
        state->stepcount = 0;
        pcVar9 = out_end + 3;
      }
LAB_0011a312:
      out_end = pcVar9;
      if ((out_pos == pcVar6) || (pcVar7 <= out_end)) {
        state->result = local_59;
        state->step = step_A;
        return (int)out_end - iVar3;
      }
      bVar1 = *out_pos;
      cVar4 = base64_encode_value((char)((int)((int)(char)bVar1 & 0xfcU) >> 2));
      *out_end = cVar4;
      local_59 = (bVar1 & 3) << 4;
      out_end = out_end + 1;
      out_pos = out_pos + 1;
LAB_0011a399:
      if ((out_pos == pcVar6) || (pcVar7 <= out_end)) {
        state->result = local_59;
        state->step = step_B;
        return (int)out_end - iVar3;
      }
      bVar1 = *out_pos;
      cVar4 = base64_encode_value(local_59 | (byte)((int)((int)(char)bVar1 & 0xf0U) >> 4));
      *out_end = cVar4;
      local_59 = (bVar1 & 0xf) << 2;
      out_end = out_end + 1;
      out_pos = out_pos + 1;
    }
    state->result = local_59;
    state->step = step_C;
    in_bin_local._4_4_ = (int)out_end - iVar3;
  }
  else {
    in_bin_local._4_4_ = 0;
  }
  return in_bin_local._4_4_;
}

Assistant:

static int
base64_encode_block(const char *in_bin, int in_len,
		    char *out_base64, int out_len,
		    struct base64_encodestate *state)
{
	const char *const in_end = in_bin + in_len;
	const char *in_pos = in_bin;
	char *out_pos = out_base64;
	char *out_end = out_base64  + out_len;
	char result;
	char fragment;

	result = state->result;

	switch (state->step)
	{
		while (1)
		{
	case step_A:
			if (in_pos == in_end || out_pos >= out_end) {
				state->result = result;
				state->step = step_A;
				return out_pos - out_base64;
			}
			fragment = *in_pos++;
			result = (fragment & 0x0fc) >> 2;
			*out_pos++ = base64_encode_value(result);
			result = (fragment & 0x003) << 4;
			/* fallthrough */
	case step_B:
			if (in_pos == in_end || out_pos >= out_end) {
				state->result = result;
				state->step = step_B;
				return out_pos - out_base64;
			}
			fragment = *in_pos++;
			result |= (fragment & 0x0f0) >> 4;
			*out_pos++ = base64_encode_value(result);
			result = (fragment & 0x00f) << 2;
			/* fallthrough */
	case step_C:
			if (in_pos == in_end || out_pos + 2 >= out_end) {
				state->result = result;
				state->step = step_C;
				return out_pos - out_base64;
			}
			fragment = *in_pos++;
			result |= (fragment & 0x0c0) >> 6;
			*out_pos++ = base64_encode_value(result);
			result  = (fragment & 0x03f) >> 0;
			*out_pos++ = base64_encode_value(result);

			/*
			 * Each full step (A->B->C) yields
			 * 4 characters.
			 */
			if (++state->stepcount * 4 == BASE64_CHARS_PER_LINE) {
				if (out_pos >= out_end)
					return out_pos - out_base64;
				*out_pos++ = '\n';
				state->stepcount = 0;
			}
		}
	}
	/* control should not reach here */
	return out_pos - out_base64;
}